

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O2

Map_Cut_t * Map_CutTableConsider(Map_Man_t *pMan,Map_CutTable_t *p,Map_Node_t **ppNodes,int nNodes)

{
  int iVar1;
  uint uVar2;
  Map_Cut_t *pMVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  
  lVar4 = 0;
  uVar7 = 0;
  if (0 < nNodes) {
    uVar7 = (ulong)(uint)nNodes;
  }
  uVar2 = 0;
  for (; uVar7 * 4 - lVar4 != 0; lVar4 = lVar4 + 4) {
    uVar2 = uVar2 + *(int *)(*(long *)((long)ppNodes + lVar4 * 2) + 0x10) *
                    *(int *)((long)s_HashPrimes + lVar4);
  }
  uVar5 = (ulong)uVar2 % (ulong)(uint)p->nBins;
  while( true ) {
    iVar8 = (int)uVar5;
    pMVar3 = p->pBins[iVar8];
    if (pMVar3 == (Map_Cut_t *)0x0) break;
    if (pMVar3->nLeaves == nNodes) {
      for (uVar5 = 0;
          (uVar6 = uVar7, uVar7 != uVar5 &&
          (uVar6 = uVar5, pMVar3->ppLeaves[uVar5] == ppNodes[uVar5])); uVar5 = uVar5 + 1) {
      }
      if ((int)uVar6 == nNodes) {
        return (Map_Cut_t *)0x0;
      }
    }
    uVar5 = (long)(iVar8 + 1) % (long)p->nBins & 0xffffffff;
  }
  if (iVar8 == -1) {
    pMVar3 = (Map_Cut_t *)0x0;
  }
  else {
    if (nNodes < 1) {
      __assert_fail("nNodes > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                    ,0x3a0,
                    "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                   );
    }
    pMVar3 = Map_CutAlloc(pMan);
    pMVar3->nLeaves = (char)nNodes;
    for (uVar7 = 0; (uint)nNodes != uVar7; uVar7 = uVar7 + 1) {
      pMVar3->ppLeaves[uVar7] = ppNodes[uVar7];
    }
    if (p->pBins[iVar8] != (Map_Cut_t *)0x0) {
      __assert_fail("p->pBins[Place] == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                    ,0x3a9,
                    "Map_Cut_t *Map_CutTableConsider(Map_Man_t *, Map_CutTable_t *, Map_Node_t **, int)"
                   );
    }
    p->pBins[iVar8] = pMVar3;
    iVar1 = p->nCuts;
    p->nCuts = iVar1 + 1;
    p->pCuts[iVar1] = iVar8;
  }
  return pMVar3;
}

Assistant:

Map_Cut_t * Map_CutTableConsider( Map_Man_t * pMan, Map_CutTable_t * p, Map_Node_t * ppNodes[], int nNodes )
{
    Map_Cut_t * pCut;
    int Place, i;
//    abctime clk;
    // check the cut
    Place = Map_CutTableLookup( p, ppNodes, nNodes );
    if ( Place == -1 )
        return NULL;
    assert( nNodes > 0 );
    // create the new cut
//clk = Abc_Clock();
    pCut = Map_CutAlloc( pMan );
//pMan->time1 += Abc_Clock() - clk;
    pCut->nLeaves = nNodes;
    for ( i = 0; i < nNodes; i++ )
        pCut->ppLeaves[i] = ppNodes[i];
    // add the cut to the table
    assert( p->pBins[Place] == NULL );
    p->pBins[Place] = pCut;
    // add the cut to the new list
    p->pCuts[ p->nCuts++ ] = Place;
    return pCut;
}